

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O2

Monom<Kernel::NumTraits<Kernel::RealConstantType>_> * __thiscall
Inferences::simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>>
          (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *__return_storage_ptr__,
          Inferences *this,Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in,
          PolyNf *simplifiedArgs,bool removeZeros)

{
  long lVar1;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar2;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_PolynomialEvaluation_cpp:364:18),_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  it;
  undefined1 auVar3 [32];
  undefined8 uVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *other;
  int iVar9;
  long lVar10;
  anon_class_1_0_00000001 pow;
  byte local_1fc;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> args;
  Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  poly_;
  Option<Kernel::RealConstantType> c;
  Numeral numeral;
  int power;
  int *local_138;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *pMStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  unsigned_long local_118;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_110;
  RationalConstantType local_100;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> local_dc;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_c0;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  local_a0;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  local_88;
  RationalConstantType local_70;
  RationalConstantType local_50;
  
  lVar1 = *(long *)(this + 0x28);
  Kernel::RationalConstantType::RationalConstantType
            (&numeral.super_RationalConstantType,(RationalConstantType *)this);
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Stack
            (&args,(*(long *)(lVar1 + 0x10) - *(long *)(lVar1 + 8)) / 0x1c & 0xffffffff);
  lVar10 = 0x18;
  uVar8 = 0;
  while( true ) {
    lVar6 = *(long *)(lVar1 + 0x10) - *(long *)(lVar1 + 8);
    if ((lVar6 / 0x1c & 0xffffffffU) <= uVar8) break;
    power = *(int *)(*(long *)(lVar1 + 8) + lVar10);
    Kernel::PolyNf::downcast<Kernel::NumTraits<Kernel::RealConstantType>>((PolyNf *)in);
    uVar4 = poly_.
            super_OptionBase<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
            ._elem._elem.init._ptr;
    if ((poly_.
         super_OptionBase<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
         ._isSome == true) &&
       (pMVar2 = ((poly_.
                   super_OptionBase<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                   ._elem._elem.init._ptr)->_summands)._stack,
       (int)(((long)((poly_.
                      super_OptionBase<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                      ._elem._elem.init._ptr)->_summands)._cursor - (long)pMVar2) / 0x30) == 1)) {
      Kernel::RationalConstantType::RationalConstantType(&local_50,(RationalConstantType *)pMVar2);
      simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>_>::anon_class_1_0_00000001::
      operator()((Numeral *)&c,&pow,(Numeral *)&local_50,power);
      Kernel::RationalConstantType::operator*=
                (&numeral.super_RationalConstantType,(RationalConstantType *)&c);
      Kernel::RationalConstantType::~RationalConstantType((RationalConstantType *)&c);
      Kernel::RationalConstantType::~RationalConstantType(&local_50);
      pMStack_130 = (((((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)uVar4)->_summands).
                     _stack)->factors)._ptr;
      local_118 = ((long)(pMStack_130->_factors)._cursor - (long)(pMStack_130->_factors)._stack) /
                  0x1c;
      local_128 = 0;
      uStack_120 = 0;
      local_138 = &power;
      auVar3 = ZEXT1632(CONCAT88(pMStack_130,local_138));
      it._iter._inner._inner._to = local_118;
      it._iter._func.power = (int *)auVar3._0_8_;
      it._iter._inner._func.a =
           (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
           auVar3._8_8_;
      it._iter._inner._inner._next = auVar3._16_8_;
      it._iter._inner._inner._from = auVar3._24_8_;
      Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>::
      loadFromIterator<Lib::IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::_lambda(auto:1)_1_,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>const&>,Inferences::simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&,Kernel::PolyNf*,bool)::_lambda(auto:1)_1_,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>>
                ((Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>> *)&args,it
                );
    }
    else {
      Lib::CoproductImpl::TrivialOperations::CopyCons::
      DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
      ::DefaultImpl(&local_88,
                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                     *)in);
      iVar9 = power;
      Lib::CoproductImpl::TrivialOperations::CopyCons::
      DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
      ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                     *)&local_dc,&local_88);
      local_dc.power = iVar9;
      Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                (&args,&local_dc);
    }
    uVar8 = uVar8 + 1;
    in = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
         &(in->numeral).super_RationalConstantType._den._val[0]._mp_d;
    lVar10 = lVar10 + 0x1c;
  }
  std::
  __sort<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>*,__gnu_cxx::__ops::_Iter_less_iter>
            (args._stack,args._cursor,lVar6 % 0x1c);
  iVar9 = 0;
  uVar8 = 0;
  do {
    if ((ulong)(((long)args._cursor - (long)args._stack) / 0x1c) <= uVar8) {
      args._cursor = args._stack + iVar9;
      Kernel::RealConstantType::RealConstantType((RealConstantType *)&c,0);
      bVar5 = Kernel::RationalConstantType::operator==
                        (&numeral.super_RationalConstantType,(RationalConstantType *)&c);
      local_1fc = (byte)simplifiedArgs;
      Kernel::RationalConstantType::~RationalConstantType((RationalConstantType *)&c);
      if ((bVar5 & local_1fc) == 1) {
        Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::zero();
      }
      else {
        Kernel::RationalConstantType::RationalConstantType
                  (&local_100,&numeral.super_RationalConstantType);
        Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Stack
                  (&local_c0,&args);
        Lib::
        perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
                  ((Lib *)&local_110,
                   (MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_c0);
        Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
                  (__return_storage_ptr__,(Numeral *)&local_100,&local_110);
        Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack
                  (&local_c0);
        Kernel::RationalConstantType::~RationalConstantType(&local_100);
      }
      Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&args);
      Kernel::RationalConstantType::~RationalConstantType(&numeral.super_RationalConstantType);
      return __return_storage_ptr__;
    }
    other = args._stack + uVar8;
    Lib::
    Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
    ::
    match<Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::Variable)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::AnyPoly)_1_>
              (&c,(Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                   *)other,((long)args._cursor - (long)args._stack) % 0x1c);
    if (c.super_OptionBase<Kernel::RealConstantType>._isSome == true) {
      Kernel::RationalConstantType::RationalConstantType
                (&local_70,
                 (RationalConstantType *)&c.super_OptionBase<Kernel::RealConstantType>._elem);
      simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>_>::anon_class_1_0_00000001::
      operator()((Numeral *)&poly_,&pow,(Numeral *)&local_70,other->power);
      Kernel::RationalConstantType::~RationalConstantType(&local_70);
      Kernel::RealConstantType::operator*
                ((RealConstantType *)&power,(RealConstantType *)&numeral.super_RationalConstantType,
                 (Numeral *)&poly_);
      Kernel::RationalConstantType::operator=
                (&numeral.super_RationalConstantType,(RationalConstantType *)&power);
      Kernel::RationalConstantType::~RationalConstantType((RationalConstantType *)&power);
      Kernel::RationalConstantType::~RationalConstantType((RationalConstantType *)&poly_);
      uVar8 = (ulong)((int)uVar8 + 1);
    }
    else {
      Lib::CoproductImpl::TrivialOperations::CopyCons::
      DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
      ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                     *)&power,
                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                     *)other);
      iVar7 = other->power;
      while (uVar8 = (ulong)((int)uVar8 + 1),
            uVar8 < (ulong)(((long)args._cursor - (long)args._stack) / 0x1c)) {
        bVar5 = Kernel::operator==(&args._stack[uVar8].term,(PolyNf *)&power);
        if (!bVar5) break;
        iVar7 = iVar7 + args._stack[uVar8].power;
      }
      if (iVar7 != 0) {
        Lib::CoproductImpl::TrivialOperations::CopyCons::
        DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
        ::DefaultImpl(&local_a0,
                      (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                       *)&power);
        Lib::CoproductImpl::TrivialOperations::CopyCons::
        DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
        ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                       *)&poly_,&local_a0);
        Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>::operator=
                  (args._stack + iVar9,
                   (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)&poly_);
        iVar9 = iVar9 + 1;
      }
    }
    Lib::OptionBase<Kernel::RealConstantType>::~OptionBase
              (&c.super_OptionBase<Kernel::RealConstantType>);
  } while( true );
}

Assistant:

Monom<Number> simplifyMonom(Monom<Number> const& in, PolyNf* simplifiedArgs, bool removeZeros)
{ 

  using Numeral      = typename Number::ConstantType;
  using Monom        = Monom<Number>;
  using MonomFactor  = MonomFactor<Number>;
  using MonomFactors = MonomFactors<Number>;

  auto pow = [](Numeral c, int power) -> Numeral {
    ASS(power > 0)
    auto out = c;
    while (--power > 0) {
      out = out * c;
    }
    return out;
  };

  
  auto& facs = *in.factors;
  auto numeral = in.numeral;
  Stack<MonomFactor> args(facs.nFactors());
  for (unsigned i = 0; i < facs.nFactors(); i++) {
    auto power = facs.factorAt(i).power;
    if (auto poly_ = simplifiedArgs[i].downcast<Number>()) {
      auto& poly = **poly_;
      if (poly.nSummands() == 1) {
        numeral *= pow(poly.summandAt(0).numeral, power);
        args.loadFromIterator(
            poly.summandAt(0).factors->iter()
            .map([&](auto fac) { fac.power *= power; return fac; }));
        continue;
      }
    }
    args.push(MonomFactor(simplifiedArgs[i], power));
  }

  std::sort(args.begin(), args.end());

  auto offs = 0;
  bool needsSorting = false;

  for (unsigned i = 0; i < args.size(); i++) {
    auto& arg = args[i];
    auto c = arg.term.template tryNumeral<Number>();
    if (c.isSome()) {
      // arg is a number constant
      auto num2 = pow(c.unwrap(), arg.power);
      numeral = numeral * num2;
    } else {
      // arg is a non-number term
      auto term  = arg.term;
      auto power = arg.power;
      while (i + 1 < args.size() && args[i + 1].term == term) {
        power += args[i + 1].power;
        i++;
      }
      if (power != 0) {
        args[offs++] = MonomFactor(term, power);
      }
    }
  }
  args.truncate(offs);

  if (needsSorting) {
    std::sort(args.begin(), args.end());
  }

  if (numeral == Numeral(0) && removeZeros) {
    return Monom::zero();
  } else {
    return Monom(numeral, perfect(MonomFactors(std::move(args))));
  }
}